

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void FindFollowSets(lemon *lemp)

{
  bool bVar1;
  int iVar2;
  int change;
  int progress;
  plink *plp;
  config *cfp;
  int i;
  lemon *lemp_local;
  
  for (cfp._4_4_ = 0; cfp._4_4_ < lemp->nstate; cfp._4_4_ = cfp._4_4_ + 1) {
    for (plp = (plink *)lemp->sorted[cfp._4_4_]->cfp; plp != (plink *)0x0; plp = plp[3].next) {
      *(undefined4 *)&plp[3].cfp = 1;
    }
  }
  do {
    bVar1 = false;
    for (cfp._4_4_ = 0; cfp._4_4_ < lemp->nstate; cfp._4_4_ = cfp._4_4_ + 1) {
      for (plp = (plink *)lemp->sorted[cfp._4_4_]->cfp; plp != (plink *)0x0; plp = plp[3].next) {
        if (*(int *)&plp[3].cfp != 0) {
          for (_change = plp[1].next; _change != (plink *)0x0; _change = _change->next) {
            iVar2 = SetUnion(_change->cfp->fws,(char *)plp[1].cfp);
            if (iVar2 != 0) {
              _change->cfp->status = INCOMPLETE;
              bVar1 = true;
            }
          }
          *(undefined4 *)&plp[3].cfp = 0;
        }
      }
    }
  } while (bVar1);
  return;
}

Assistant:

void FindFollowSets(struct lemon *lemp)
{
  int i;
  struct config *cfp;
  struct plink *plp;
  int progress;
  int change;

  for(i=0; i<lemp->nstate; i++){
    for(cfp=lemp->sorted[i]->cfp; cfp; cfp=cfp->next){
      cfp->status = INCOMPLETE;
    }
  }
  
  do{
    progress = 0;
    for(i=0; i<lemp->nstate; i++){
      for(cfp=lemp->sorted[i]->cfp; cfp; cfp=cfp->next){
        if( cfp->status==COMPLETE ) continue;
        for(plp=cfp->fplp; plp; plp=plp->next){
          change = SetUnion(plp->cfp->fws,cfp->fws);
          if( change ){
            plp->cfp->status = INCOMPLETE;
            progress = 1;
	  }
	}
        cfp->status = COMPLETE;
      }
    }
  }while( progress );
}